

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O3

set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
ChecksumMethods(set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                *__return_storage_ptr__,uint8_t *buf,int len)

{
  _Rb_tree_header *p_Var1;
  uint8_t *puVar2;
  uint *puVar3;
  uint16_t uVar4;
  int iVar5;
  ulong in_RAX;
  long lVar6;
  uint uVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  undefined1 auVar9 [16];
  undefined4 uVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar29;
  uint uVar30;
  uint uVar31;
  CRC16 crc;
  undefined8 uStack_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (len < 0x1801) {
    return __return_storage_ptr__;
  }
  uStack_28 = in_RAX;
  if ((uint)len < 0x1803) {
    if (len == 0x1801) goto LAB_0015860c;
  }
  else if ((buf[0x1800] == 0x8c) && (buf[0x1801] == '\x15')) {
    uStack_28._0_4_ = (undefined4)in_RAX;
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  CRC16::CRC16((CRC16 *)((long)&uStack_28 + 2),buf,0x1802,0xd2f6);
  uVar4 = CRC16::operator_cast_to_unsigned_short((CRC16 *)((long)&uStack_28 + 2));
  if (uVar4 == 0) {
    uStack_28 = CONCAT44(5,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  if (0x1803 < (uint)len) {
    CRC16::CRC16((CRC16 *)((long)&uStack_28 + 2),buf,0x1804,0xd2f6);
    uVar4 = CRC16::operator_cast_to_unsigned_short((CRC16 *)((long)&uStack_28 + 2));
    if (uVar4 == 0) {
      uStack_28 = CONCAT44(6,(undefined4)uStack_28);
      std::
      _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
      ::_M_insert_unique<ChecksumType>
                (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
    }
  }
LAB_0015860c:
  cVar8 = '\0';
  cVar10 = '\0';
  cVar11 = '\0';
  cVar12 = '\0';
  cVar13 = '\0';
  cVar14 = '\0';
  cVar15 = '\0';
  cVar16 = '\0';
  cVar17 = '\0';
  cVar18 = '\0';
  cVar19 = '\0';
  cVar20 = '\0';
  cVar21 = '\0';
  cVar22 = '\0';
  cVar23 = '\0';
  cVar24 = '\0';
  lVar6 = 0;
  do {
    puVar2 = buf + lVar6;
    cVar8 = cVar8 + *puVar2;
    cVar10 = cVar10 + puVar2[1];
    cVar11 = cVar11 + puVar2[2];
    cVar12 = cVar12 + puVar2[3];
    cVar13 = cVar13 + puVar2[4];
    cVar14 = cVar14 + puVar2[5];
    cVar15 = cVar15 + puVar2[6];
    cVar16 = cVar16 + puVar2[7];
    cVar17 = cVar17 + puVar2[8];
    cVar18 = cVar18 + puVar2[9];
    cVar19 = cVar19 + puVar2[10];
    cVar20 = cVar20 + puVar2[0xb];
    cVar21 = cVar21 + puVar2[0xc];
    cVar22 = cVar22 + puVar2[0xd];
    cVar23 = cVar23 + puVar2[0xe];
    cVar24 = cVar24 + puVar2[0xf];
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x1800);
  auVar25[0] = cVar17 + cVar8;
  auVar25[1] = cVar18 + cVar10;
  auVar25[2] = cVar19 + cVar11;
  auVar25[3] = cVar20 + cVar12;
  auVar25[4] = cVar21 + cVar13;
  auVar25[5] = cVar22 + cVar14;
  auVar25[6] = cVar23 + cVar15;
  auVar25[7] = cVar24 + cVar16;
  auVar25[8] = cVar17 * '\x02';
  auVar25[9] = cVar18 * '\x02';
  auVar25[10] = cVar19 * '\x02';
  auVar25[0xb] = cVar20 * '\x02';
  auVar25[0xc] = cVar21 * '\x02';
  auVar25[0xd] = cVar22 * '\x02';
  auVar25[0xe] = cVar23 * '\x02';
  auVar25[0xf] = cVar24 * '\x02';
  auVar25 = psadbw(auVar25,(undefined1  [16])0x0);
  if (buf[0x1800] == auVar25[0]) {
    uStack_28 = CONCAT44(2,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  uVar7 = 0;
  uVar29 = 0;
  uVar30 = 0;
  uVar31 = 0;
  lVar6 = 0;
  do {
    puVar3 = (uint *)(buf + lVar6);
    uVar7 = uVar7 ^ *puVar3;
    uVar29 = uVar29 ^ puVar3[1];
    uVar30 = uVar30 ^ puVar3[2];
    uVar31 = uVar31 ^ puVar3[3];
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x1800);
  uVar7 = uVar31 ^ uVar29 ^ uVar30 ^ uVar7;
  uVar7 = uVar7 >> 0x10 ^ uVar7;
  uVar7 = uVar7 >> 8 & 0xff ^ uVar7;
  if (buf[0x1800] == (uint8_t)uVar7) {
    uStack_28 = CONCAT44(3,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  if (0x189f < len) {
    auVar25 = ZEXT416(uVar7 & 0xff);
    lVar6 = 0;
    do {
      auVar25 = auVar25 ^ *(undefined1 (*) [16])(buf + lVar6 + 0x1800);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0xa0);
    auVar26._0_8_ = auVar25._8_8_;
    auVar26._8_4_ = auVar25._8_4_;
    auVar26._12_4_ = auVar25._12_4_;
    uVar28 = SUB164(auVar26 ^ auVar25,4);
    auVar9._4_4_ = uVar28;
    auVar9._0_4_ = uVar28;
    auVar9._8_4_ = uVar28;
    auVar9._12_4_ = uVar28;
    auVar9 = auVar9 ^ auVar26 ^ auVar25;
    auVar27._0_4_ = auVar9._0_4_ >> 0x10;
    auVar27._4_4_ = 0;
    auVar27._8_4_ = auVar9._8_4_ >> 0x10;
    auVar27._12_4_ = auVar9._12_4_ >> 0x10;
    if (buf[0x18a0] == (byte)(SUB161(auVar27 ^ auVar9,1) ^ SUB161(auVar27 ^ auVar9,0))) {
      uStack_28 = CONCAT44(4,(undefined4)uStack_28);
      std::
      _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
      ::_M_insert_unique<ChecksumType>
                (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
    }
  }
  if (((__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     (iVar5 = bcmp(buf,buf + 1,0x17ff), iVar5 == 0)) {
    uStack_28 = uStack_28 & 0xffffffff;
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<ChecksumType> ChecksumMethods(const uint8_t* buf, int len)
{
    std::set<ChecksumType> methods;

    // If there's not enough data, there can be no checksum. Return an empty set.
    if (len <= 0x1800)
        return methods;

    // 2-byte CRC
    {
        // Check for CRC of 8C 15, which seems to be a strange fixed checksum found on some disks.
        // This is known to be used by The Cycles (+3), Vigilante (CPC), and Les Hits de Noel (CPC).
        if (len >= 0x1803 && buf[0x1800] == 0x8c && buf[0x1801] == 0x15)
            methods.insert(ChecksumType::Constant_8C15);

        // Calculate the CRC-16 of the first 0x1800 bytes, using a custom CRC init of D2F6.
        // This is known to be used by JPP's Goal Busters (CPC).
        if (len >= 0x1802)
        {
            CRC16 crc(buf, 0x1800 + 2, 0xd2f6); // include CRC bytes
            if (!crc)
                methods.insert(ChecksumType::CRC_D2F6_1800);
        }

        // Calculate the CRC-16 of the first 0x1802 bytes, using a custom CRC init of D2F6.
        // This is known to be used by Les Fous du Foot (CPC).
        if (len >= 0x1804)
        {
            CRC16 crc(buf, 0x1802 + 2, 0xd2f6); // include CRC bytes
            if (!crc)
                methods.insert(ChecksumType::CRC_D2F6_1802);
        }
    }

    // 1-byte checksum
    {
        // Sum the first 6K
        auto sum = static_cast<uint8_t>(std::accumulate(buf, buf + 0x1800, 0));
        if (buf[0x1800] == sum)
            methods.insert(ChecksumType::Sum_1800);

        // XOR together the first 6K
        auto xor_ = static_cast<uint8_t>(
            std::accumulate(buf, buf + 0x1800, 0, std::bit_xor<int>()));
        if (buf[0x1800] == xor_)
            methods.insert(ChecksumType::XOR_1800);

        if (len >= 0x18a0)
        {
            // Extend the XOR to 0x18a0 bytes, as needed for Coin-Op Hits
            xor_ = static_cast<uint8_t>(
                std::accumulate(buf + 0x1800, buf + 0x18a0, xor_, std::bit_xor<uint8_t>()));
            if (buf[0x18a0] == xor_)
                methods.insert(ChecksumType::XOR_18A0);
        }
    }

    // Check 6K of filler on unused tracks (Vigilante on CPC)
    // This is only done if we haven't yet matched another method.
    if (methods.empty() && !memcmp(buf, buf + 1, 0x17ff))
        methods.insert(ChecksumType::None);

    return methods;
}